

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

EcsTrigger * trigger_find_or_create(ecs_vector_t **triggers,ecs_entity_t entity)

{
  uint uVar1;
  EcsTrigger *trigger;
  EcsTrigger *pEVar2;
  ulong uVar3;
  
  uVar1 = ecs_vector_count(*triggers);
  pEVar2 = (EcsTrigger *)_ecs_vector_first(*triggers,0x28,0x10);
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
    do {
      if (pEVar2->self == entity) {
        return pEVar2;
      }
      pEVar2 = pEVar2 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  pEVar2 = (EcsTrigger *)_ecs_vector_add(triggers,0x28,0x10);
  return pEVar2;
}

Assistant:

static
EcsTrigger* trigger_find_or_create(
    ecs_vector_t **triggers,
    ecs_entity_t entity)
{
    ecs_vector_each(*triggers, EcsTrigger, trigger, {
        if (trigger->self == entity) {
            return trigger;
        }
    });

    EcsTrigger *result = ecs_vector_add(triggers, EcsTrigger);
    return result;
}